

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s;
  Metric *this;
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tVar4;
  TimeValue tv;
  json config;
  string config_file;
  string metric_name;
  Directory out_directory;
  undefined1 local_108 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string local_d8;
  Directory local_b8;
  
  local_f8._M_allocated_capacity = (size_type)&local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"config.json","");
  if (1 < argc) {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_f8,0,(char *)local_f8._8_8_,(ulong)__s);
  }
  uVar2 = 600000000;
  if (2 < argc) {
    uVar2 = atoll(argv[2]);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"dummy","");
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f8,
             auto_format);
  read_json_from_file((path *)local_108);
  std::filesystem::__cxx11::path::~path((path *)&local_b8);
  hta::Directory::Directory(&local_b8,(json *)local_108,false);
  this = hta::Directory::operator[](&local_b8,&local_d8);
  if (0 < (long)uVar2) {
    tVar4.__d.__r = (duration)1000000;
    uVar3 = 0;
    do {
      if ((uVar3 / 1000000) * 1000000 - uVar3 == 0) {
        poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1," rows completed.",0x10);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
      }
      tv.value = 42.0;
      tv.time.
      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.__d.
      __r = (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)
            tVar4.__d.__r;
      hta::Metric::insert(this,tv);
      uVar3 = uVar3 + 1;
      tVar4.__d.__r = (duration)((long)tVar4.__d.__r + 50000000);
    } while (uVar2 != uVar3);
  }
  hta::Directory::~Directory(&local_b8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_108);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_108 + 8),local_108[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_allocated_capacity != &local_e8) {
    operator_delete((void *)local_f8._M_allocated_capacity,local_e8._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    std::string config_file = "config.json";
    std::int64_t count = 600000000;
    if (argc > 1)
    {
        config_file = argv[1];
    }
    if (argc > 2)
    {
        count = atoll(argv[2]);
    }
    std::string metric_name = "dummy";

    auto config = read_json_from_file(std::filesystem::path(config_file));
    hta::Directory out_directory(config);
    auto& metric = out_directory[metric_name];
    for (std::int64_t row = 0; row < count; row++)
    {
        if (row % 1000000 == 0)
        {
            std::cout << row << " rows completed." << std::endl;
        }
        metric.insert(hta::TimeValue(
            hta::TimePoint(hta::duration_cast(std::chrono::milliseconds(1 + 50 * row))), 42.0));
    }
}